

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

void __thiscall sznet::net::Poller::Poller(Poller *this,EventLoop *loop)

{
  EventLoop *loop_local;
  Poller *this_local;
  
  this->_vptr_Poller = (_func_int **)&PTR__Poller_0014ad10;
  std::
  map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
  ::map(&this->m_channels);
  this->m_ownerLoop = loop;
  return;
}

Assistant:

Poller::Poller(EventLoop* loop): 
	m_ownerLoop(loop)
{
}